

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Mish_x86_avx::forward_inplace(Mish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  void *pvVar11;
  int iVar12;
  undefined1 (*pauVar13) [32];
  int _c;
  int iVar14;
  long lVar15;
  int iVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar78;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar75;
  float fVar77;
  float fVar79;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  float fVar74;
  float fVar76;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 in_ZMM2 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [16];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  Mat local_78;
  undefined1 auVar68 [32];
  undefined1 auVar73 [32];
  
  iVar14 = bottom_top_blob->c;
  iVar16 = bottom_top_blob->h * bottom_top_blob->w;
  _c = 0;
  if (bottom_top_blob->elempack == 8) {
    if (iVar16 < 1) {
      iVar16 = _c;
    }
    if (iVar14 < 1) {
      iVar14 = 0;
    }
    for (; _c != iVar14; _c = _c + 1) {
      in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
      Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar13 = (undefined1 (*) [32])local_78.data;
      Mat::~Mat(&local_78);
      iVar12 = iVar16;
      while (bVar17 = iVar12 != 0, iVar12 = iVar12 + -1, bVar17) {
        auVar1 = *pauVar13;
        auVar21._8_4_ = 0x42b0c0a5;
        auVar21._0_8_ = 0x42b0c0a542b0c0a5;
        auVar21._12_4_ = 0x42b0c0a5;
        auVar21._16_4_ = 0x42b0c0a5;
        auVar21._20_4_ = 0x42b0c0a5;
        auVar21._24_4_ = 0x42b0c0a5;
        auVar21._28_4_ = 0x42b0c0a5;
        auVar21 = vminps_avx(auVar1,auVar21);
        auVar22._8_4_ = 0xc2b0c0a5;
        auVar22._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar22._12_4_ = 0xc2b0c0a5;
        auVar22._16_4_ = 0xc2b0c0a5;
        auVar22._20_4_ = 0xc2b0c0a5;
        auVar22._24_4_ = 0xc2b0c0a5;
        auVar22._28_4_ = 0xc2b0c0a5;
        auVar2 = vmaxps_avx(auVar21,auVar22);
        auVar122._8_4_ = 0x3f000000;
        auVar122._0_8_ = 0x3f0000003f000000;
        auVar122._12_4_ = 0x3f000000;
        auVar122._16_4_ = 0x3f000000;
        auVar122._20_4_ = 0x3f000000;
        auVar122._24_4_ = 0x3f000000;
        auVar122._28_4_ = 0x3f000000;
        auVar59._0_4_ = auVar2._0_4_ * 1.442695 + 0.5;
        auVar59._4_4_ = auVar2._4_4_ * 1.442695 + 0.5;
        auVar59._8_4_ = auVar2._8_4_ * 1.442695 + 0.5;
        auVar59._12_4_ = auVar2._12_4_ * 1.442695 + 0.5;
        auVar59._16_4_ = auVar2._16_4_ * 1.442695 + 0.5;
        auVar59._20_4_ = auVar2._20_4_ * 1.442695 + 0.5;
        auVar59._24_4_ = auVar2._24_4_ * 1.442695 + 0.5;
        auVar59._28_4_ = in_ZMM2._28_4_ + 0.5;
        auVar22 = vroundps_avx(auVar59,1);
        auVar21 = vcmpps_avx(auVar59,auVar22,1);
        auVar115._8_4_ = 0x3f800000;
        auVar115._0_8_ = 0x3f8000003f800000;
        auVar115._12_4_ = 0x3f800000;
        auVar115._16_4_ = 0x3f800000;
        auVar115._20_4_ = 0x3f800000;
        auVar115._24_4_ = 0x3f800000;
        auVar115._28_4_ = 0x3f800000;
        auVar21 = vandps_avx(auVar21,auVar115);
        auVar21 = vsubps_avx(auVar22,auVar21);
        auVar3._4_4_ = auVar21._4_4_ * 0.6931472;
        auVar3._0_4_ = auVar21._0_4_ * 0.6931472;
        auVar3._8_4_ = auVar21._8_4_ * 0.6931472;
        auVar3._12_4_ = auVar21._12_4_ * 0.6931472;
        auVar3._16_4_ = auVar21._16_4_ * 0.6931472;
        auVar3._20_4_ = auVar21._20_4_ * 0.6931472;
        auVar3._24_4_ = auVar21._24_4_ * 0.6931472;
        auVar3._28_4_ = auVar22._28_4_;
        auVar2 = vsubps_avx(auVar2,auVar3);
        fVar36 = auVar2._0_4_;
        fVar74 = auVar2._4_4_;
        fVar76 = auVar2._8_4_;
        fVar78 = auVar2._12_4_;
        fVar80 = auVar2._16_4_;
        fVar82 = auVar2._20_4_;
        fVar84 = auVar2._24_4_;
        auVar49._0_4_ = (int)auVar21._0_4_;
        auVar49._4_4_ = (int)auVar21._4_4_;
        auVar49._8_4_ = (int)auVar21._8_4_;
        auVar49._12_4_ = (int)auVar21._12_4_;
        auVar60._16_4_ = (int)auVar21._16_4_;
        auVar60._0_16_ = auVar49;
        auVar60._20_4_ = (int)auVar21._20_4_;
        auVar60._24_4_ = (int)auVar21._24_4_;
        auVar60._28_4_ = (int)auVar21._28_4_;
        auVar41 = vpslld_avx(auVar49,0x17);
        auVar49 = vpslld_avx(auVar60._16_16_,0x17);
        auVar88._8_4_ = 0x3f800000;
        auVar88._0_8_ = 0x3f8000003f800000;
        auVar88._12_4_ = 0x3f800000;
        auVar49 = vpaddd_avx(auVar49,auVar88);
        auVar41 = vpaddd_avx(auVar41,auVar88);
        auVar32._0_4_ =
             (fVar36 + 1.0 +
             fVar36 * fVar36 *
             (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
               0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5)) * auVar41._0_4_ + 1.0;
        auVar32._4_4_ =
             (fVar74 + 1.0 +
             fVar74 * fVar74 *
             (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
               0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5)) * auVar41._4_4_ + 1.0;
        auVar32._8_4_ =
             (fVar76 + 1.0 +
             fVar76 * fVar76 *
             (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) * fVar76 +
               0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5)) * auVar41._8_4_ + 1.0;
        auVar32._12_4_ =
             (fVar78 + 1.0 +
             fVar78 * fVar78 *
             (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78 +
               0.041665796) * fVar78 + 0.16666666) * fVar78 + 0.5)) * auVar41._12_4_ + 1.0;
        auVar32._16_4_ =
             (fVar80 + 1.0 +
             fVar80 * fVar80 *
             (((((fVar80 * 0.00019875691 + 0.0013981999) * fVar80 + 0.008333452) * fVar80 +
               0.041665796) * fVar80 + 0.16666666) * fVar80 + 0.5)) * auVar49._0_4_ + 1.0;
        auVar32._20_4_ =
             (fVar82 + 1.0 +
             fVar82 * fVar82 *
             (((((fVar82 * 0.00019875691 + 0.0013981999) * fVar82 + 0.008333452) * fVar82 +
               0.041665796) * fVar82 + 0.16666666) * fVar82 + 0.5)) * auVar49._4_4_ + 1.0;
        auVar32._24_4_ =
             (fVar84 + 1.0 +
             fVar84 * fVar84 *
             (((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84 +
               0.041665796) * fVar84 + 0.16666666) * fVar84 + 0.5)) * auVar49._8_4_ + 1.0;
        auVar32._28_4_ = auVar2._28_4_ + 1.0 + auVar22._28_4_ + 1.0;
        auVar61._8_4_ = 0x800000;
        auVar61._0_8_ = 0x80000000800000;
        auVar61._12_4_ = 0x800000;
        auVar61._16_4_ = 0x800000;
        auVar61._20_4_ = 0x800000;
        auVar61._24_4_ = 0x800000;
        auVar61._28_4_ = 0x800000;
        auVar22 = vmaxps_avx(auVar32,auVar61);
        auVar49 = vpsrld_avx(auVar22._16_16_,0x17);
        auVar62._8_4_ = 0x807fffff;
        auVar62._0_8_ = 0x807fffff807fffff;
        auVar62._12_4_ = 0x807fffff;
        auVar62._16_4_ = 0x807fffff;
        auVar62._20_4_ = 0x807fffff;
        auVar62._24_4_ = 0x807fffff;
        auVar62._28_4_ = 0x807fffff;
        auVar21 = vandps_avx(auVar22,auVar62);
        auVar3 = vorps_avx(auVar122,auVar21);
        auVar109._8_4_ = 0x3f3504f3;
        auVar109._0_8_ = 0x3f3504f33f3504f3;
        auVar109._12_4_ = 0x3f3504f3;
        auVar109._16_4_ = 0x3f3504f3;
        auVar109._20_4_ = 0x3f3504f3;
        auVar109._24_4_ = 0x3f3504f3;
        auVar109._28_4_ = 0x3f3504f3;
        auVar2 = vcmpps_avx(auVar109,auVar3,2);
        auVar21 = vandnps_avx(auVar2,auVar3);
        fVar36 = auVar3._0_4_ + -1.0 + auVar21._0_4_;
        fVar74 = auVar3._4_4_ + -1.0 + auVar21._4_4_;
        fVar76 = auVar3._8_4_ + -1.0 + auVar21._8_4_;
        fVar78 = auVar3._12_4_ + -1.0 + auVar21._12_4_;
        fVar80 = auVar3._16_4_ + -1.0 + auVar21._16_4_;
        fVar82 = auVar3._20_4_ + -1.0 + auVar21._20_4_;
        fVar84 = auVar3._24_4_ + -1.0 + auVar21._24_4_;
        auVar49 = vpsubd_avx(auVar49,auVar2._16_16_);
        auVar41 = vpsrld_avx(auVar22._0_16_,0x17);
        auVar111._8_4_ = 0xffffff81;
        auVar111._0_8_ = 0xffffff81ffffff81;
        auVar111._12_4_ = 0xffffff81;
        auVar49 = vpaddd_avx(auVar49,auVar111);
        auVar41 = vpsubd_avx(auVar41,auVar2._0_16_);
        auVar41 = vpaddd_avx(auVar41,auVar111);
        auVar97._16_16_ = auVar49;
        auVar97._0_16_ = auVar41;
        auVar2 = vcmpps_avx(auVar32,_DAT_002d8520,2);
        auVar22 = vcvtdq2ps_avx(auVar97);
        auVar4._4_4_ = (auVar22._4_4_ * 0.6931472 + fVar74 +
                       fVar74 * fVar74 *
                       (((((((((fVar74 * 0.070376836 + -0.1151461) * fVar74 + 0.116769984) * fVar74
                             + -0.12420141) * fVar74 + 0.14249323) * fVar74 + -0.16668057) * fVar74
                          + 0.20000714) * fVar74 + -0.24999994) * fVar74 + 0.3333333) * fVar74 +
                       -0.5)) * -2.0;
        auVar4._0_4_ = (auVar22._0_4_ * 0.6931472 + fVar36 +
                       fVar36 * fVar36 *
                       (((((((((fVar36 * 0.070376836 + -0.1151461) * fVar36 + 0.116769984) * fVar36
                             + -0.12420141) * fVar36 + 0.14249323) * fVar36 + -0.16668057) * fVar36
                          + 0.20000714) * fVar36 + -0.24999994) * fVar36 + 0.3333333) * fVar36 +
                       -0.5)) * -2.0;
        auVar4._8_4_ = (auVar22._8_4_ * 0.6931472 + fVar76 +
                       fVar76 * fVar76 *
                       (((((((((fVar76 * 0.070376836 + -0.1151461) * fVar76 + 0.116769984) * fVar76
                             + -0.12420141) * fVar76 + 0.14249323) * fVar76 + -0.16668057) * fVar76
                          + 0.20000714) * fVar76 + -0.24999994) * fVar76 + 0.3333333) * fVar76 +
                       -0.5)) * -2.0;
        auVar4._12_4_ =
             (auVar22._12_4_ * 0.6931472 + fVar78 +
             fVar78 * fVar78 *
             (((((((((fVar78 * 0.070376836 + -0.1151461) * fVar78 + 0.116769984) * fVar78 +
                   -0.12420141) * fVar78 + 0.14249323) * fVar78 + -0.16668057) * fVar78 + 0.20000714
                ) * fVar78 + -0.24999994) * fVar78 + 0.3333333) * fVar78 + -0.5)) * -2.0;
        auVar4._16_4_ =
             (auVar22._16_4_ * 0.6931472 + fVar80 +
             fVar80 * fVar80 *
             (((((((((fVar80 * 0.070376836 + -0.1151461) * fVar80 + 0.116769984) * fVar80 +
                   -0.12420141) * fVar80 + 0.14249323) * fVar80 + -0.16668057) * fVar80 + 0.20000714
                ) * fVar80 + -0.24999994) * fVar80 + 0.3333333) * fVar80 + -0.5)) * -2.0;
        auVar4._20_4_ =
             (auVar22._20_4_ * 0.6931472 + fVar82 +
             fVar82 * fVar82 *
             (((((((((fVar82 * 0.070376836 + -0.1151461) * fVar82 + 0.116769984) * fVar82 +
                   -0.12420141) * fVar82 + 0.14249323) * fVar82 + -0.16668057) * fVar82 + 0.20000714
                ) * fVar82 + -0.24999994) * fVar82 + 0.3333333) * fVar82 + -0.5)) * -2.0;
        auVar4._24_4_ =
             (auVar22._24_4_ * 0.6931472 + fVar84 +
             fVar84 * fVar84 *
             (((((((((fVar84 * 0.070376836 + -0.1151461) * fVar84 + 0.116769984) * fVar84 +
                   -0.12420141) * fVar84 + 0.14249323) * fVar84 + -0.16668057) * fVar84 + 0.20000714
                ) * fVar84 + -0.24999994) * fVar84 + 0.3333333) * fVar84 + -0.5)) * -2.0;
        auVar4._28_4_ = auVar22._28_4_ + auVar3._28_4_ + -1.0 + auVar21._28_4_ + 0.0;
        auVar98._8_4_ = 0x7fffffff;
        auVar98._0_8_ = 0x7fffffff7fffffff;
        auVar98._12_4_ = 0x7fffffff;
        auVar98._16_4_ = 0x7fffffff;
        auVar98._20_4_ = 0x7fffffff;
        auVar98._24_4_ = 0x7fffffff;
        auVar98._28_4_ = 0x7fffffff;
        auVar21 = vblendvps_avx(auVar4,auVar98,auVar2);
        auVar63._8_4_ = 0x42b0c0a5;
        auVar63._0_8_ = 0x42b0c0a542b0c0a5;
        auVar63._12_4_ = 0x42b0c0a5;
        auVar63._16_4_ = 0x42b0c0a5;
        auVar63._20_4_ = 0x42b0c0a5;
        auVar63._24_4_ = 0x42b0c0a5;
        auVar63._28_4_ = 0x42b0c0a5;
        auVar21 = vminps_avx(auVar21,auVar63);
        auVar64._8_4_ = 0xc2b0c0a5;
        auVar64._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar64._12_4_ = 0xc2b0c0a5;
        auVar64._16_4_ = 0xc2b0c0a5;
        auVar64._20_4_ = 0xc2b0c0a5;
        auVar64._24_4_ = 0xc2b0c0a5;
        auVar64._28_4_ = 0xc2b0c0a5;
        auVar2 = vmaxps_avx(auVar21,auVar64);
        auVar65._0_4_ = auVar2._0_4_ * 1.442695 + 0.5;
        auVar65._4_4_ = auVar2._4_4_ * 1.442695 + 0.5;
        auVar65._8_4_ = auVar2._8_4_ * 1.442695 + 0.5;
        auVar65._12_4_ = auVar2._12_4_ * 1.442695 + 0.5;
        auVar65._16_4_ = auVar2._16_4_ * 1.442695 + 0.5;
        auVar65._20_4_ = auVar2._20_4_ * 1.442695 + 0.5;
        auVar65._24_4_ = auVar2._24_4_ * 1.442695 + 0.5;
        auVar65._28_4_ = 0x3ff8aa3b;
        auVar22 = vroundps_avx(auVar65,1);
        auVar21 = vcmpps_avx(auVar65,auVar22,1);
        auVar21 = vandps_avx(auVar21,auVar115);
        auVar21 = vsubps_avx(auVar22,auVar21);
        auVar5._4_4_ = auVar21._4_4_ * 0.6931472;
        auVar5._0_4_ = auVar21._0_4_ * 0.6931472;
        auVar5._8_4_ = auVar21._8_4_ * 0.6931472;
        auVar5._12_4_ = auVar21._12_4_ * 0.6931472;
        auVar5._16_4_ = auVar21._16_4_ * 0.6931472;
        auVar5._20_4_ = auVar21._20_4_ * 0.6931472;
        auVar5._24_4_ = auVar21._24_4_ * 0.6931472;
        auVar5._28_4_ = auVar22._28_4_;
        auVar2 = vsubps_avx(auVar2,auVar5);
        fVar36 = auVar2._0_4_;
        fVar74 = auVar2._4_4_;
        fVar76 = auVar2._8_4_;
        fVar78 = auVar2._12_4_;
        fVar80 = auVar2._16_4_;
        fVar82 = auVar2._20_4_;
        fVar84 = auVar2._24_4_;
        auVar41._0_4_ = (int)auVar21._0_4_;
        auVar41._4_4_ = (int)auVar21._4_4_;
        auVar41._8_4_ = (int)auVar21._8_4_;
        auVar41._12_4_ = (int)auVar21._12_4_;
        auVar66._16_4_ = (int)auVar21._16_4_;
        auVar66._0_16_ = auVar41;
        auVar66._20_4_ = (int)auVar21._20_4_;
        auVar66._24_4_ = (int)auVar21._24_4_;
        auVar66._28_4_ = (int)auVar21._28_4_;
        auVar41 = vpslld_avx(auVar41,0x17);
        auVar49 = vpslld_avx(auVar66._16_16_,0x17);
        auVar49 = vpaddd_avx(auVar49,auVar88);
        auVar41 = vpaddd_avx(auVar41,auVar88);
        auVar33._0_4_ =
             (fVar36 + 1.0 +
             fVar36 * fVar36 *
             (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
               0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5)) * auVar41._0_4_ + 1.0;
        auVar33._4_4_ =
             (fVar74 + 1.0 +
             fVar74 * fVar74 *
             (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
               0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5)) * auVar41._4_4_ + 1.0;
        auVar33._8_4_ =
             (fVar76 + 1.0 +
             fVar76 * fVar76 *
             (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) * fVar76 +
               0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5)) * auVar41._8_4_ + 1.0;
        auVar33._12_4_ =
             (fVar78 + 1.0 +
             fVar78 * fVar78 *
             (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78 +
               0.041665796) * fVar78 + 0.16666666) * fVar78 + 0.5)) * auVar41._12_4_ + 1.0;
        auVar33._16_4_ =
             (fVar80 + 1.0 +
             fVar80 * fVar80 *
             (((((fVar80 * 0.00019875691 + 0.0013981999) * fVar80 + 0.008333452) * fVar80 +
               0.041665796) * fVar80 + 0.16666666) * fVar80 + 0.5)) * auVar49._0_4_ + 1.0;
        auVar33._20_4_ =
             (fVar82 + 1.0 +
             fVar82 * fVar82 *
             (((((fVar82 * 0.00019875691 + 0.0013981999) * fVar82 + 0.008333452) * fVar82 +
               0.041665796) * fVar82 + 0.16666666) * fVar82 + 0.5)) * auVar49._4_4_ + 1.0;
        auVar33._24_4_ =
             (fVar84 + 1.0 +
             fVar84 * fVar84 *
             (((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84 +
               0.041665796) * fVar84 + 0.16666666) * fVar84 + 0.5)) * auVar49._8_4_ + 1.0;
        auVar33._28_4_ = auVar2._28_4_ + 1.0 + auVar22._28_4_ + 1.0;
        auVar21 = vrcpps_avx(auVar33);
        fVar36 = auVar21._0_4_;
        fVar74 = auVar21._4_4_;
        fVar76 = auVar21._8_4_;
        fVar78 = auVar21._12_4_;
        fVar80 = auVar21._16_4_;
        fVar82 = auVar21._20_4_;
        fVar84 = auVar21._24_4_;
        auVar2._4_4_ = auVar33._4_4_ * (fVar74 + fVar74);
        auVar2._0_4_ = auVar33._0_4_ * (fVar36 + fVar36);
        auVar2._8_4_ = auVar33._8_4_ * (fVar76 + fVar76);
        auVar2._12_4_ = auVar33._12_4_ * (fVar78 + fVar78);
        auVar2._16_4_ = auVar33._16_4_ * (fVar80 + fVar80);
        auVar2._20_4_ = auVar33._20_4_ * (fVar82 + fVar82);
        auVar2._24_4_ = auVar33._24_4_ * (fVar84 + fVar84);
        auVar2._28_4_ = auVar33._28_4_;
        auVar23._8_4_ = 0x40000000;
        auVar23._0_8_ = 0x4000000040000000;
        auVar23._12_4_ = 0x40000000;
        auVar23._16_4_ = 0x40000000;
        auVar23._20_4_ = 0x40000000;
        auVar23._24_4_ = 0x40000000;
        auVar23._28_4_ = 0x40000000;
        auVar2 = vsubps_avx(auVar23,auVar2);
        fVar37 = fVar36 + fVar36 + -1.0;
        fVar75 = fVar74 + fVar74 + -1.0;
        fVar77 = fVar76 + fVar76 + -1.0;
        fVar79 = fVar78 + fVar78 + -1.0;
        fVar81 = fVar80 + fVar80 + -1.0;
        fVar83 = fVar82 + fVar82 + -1.0;
        fVar85 = fVar84 + fVar84 + -1.0;
        in_ZMM2 = ZEXT3264(CONCAT428(auVar21._28_4_ + auVar21._28_4_ + -1.0,
                                     CONCAT424(fVar85,CONCAT420(fVar83,CONCAT416(fVar81,CONCAT412(
                                                  fVar79,CONCAT48(fVar77,CONCAT44(fVar75,fVar37)))))
                                              )));
        local_98 = auVar1._0_4_;
        fStack_94 = auVar1._4_4_;
        fStack_90 = auVar1._8_4_;
        fStack_8c = auVar1._12_4_;
        fStack_88 = auVar1._16_4_;
        fStack_84 = auVar1._20_4_;
        fStack_80 = auVar1._24_4_;
        auVar1._4_4_ = (fVar75 + fVar74 * auVar2._4_4_) * fStack_94;
        auVar1._0_4_ = (fVar37 + fVar36 * auVar2._0_4_) * local_98;
        auVar1._8_4_ = (fVar77 + fVar76 * auVar2._8_4_) * fStack_90;
        auVar1._12_4_ = (fVar79 + fVar78 * auVar2._12_4_) * fStack_8c;
        auVar1._16_4_ = (fVar81 + fVar80 * auVar2._16_4_) * fStack_88;
        auVar1._20_4_ = (fVar83 + fVar82 * auVar2._20_4_) * fStack_84;
        auVar1._24_4_ = (fVar85 + fVar84 * auVar2._24_4_) * fStack_80;
        auVar1._28_4_ = 0x40000000;
        *pauVar13 = auVar1;
        pauVar13 = pauVar13 + 1;
      }
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (iVar16 < 1) {
      iVar16 = _c;
    }
    if (iVar14 < 1) {
      iVar14 = 0;
    }
    for (; _c != iVar14; _c = _c + 1) {
      Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar13 = (undefined1 (*) [32])local_78.data;
      Mat::~Mat(&local_78);
      auVar119._8_4_ = 0x3f800000;
      auVar119._0_8_ = 0x3f8000003f800000;
      auVar119._12_4_ = 0x3f800000;
      auVar124._8_4_ = 0x3f000000;
      auVar124._0_8_ = 0x3f0000003f000000;
      auVar124._12_4_ = 0x3f000000;
      iVar12 = iVar16;
      while (bVar17 = iVar12 != 0, iVar12 = iVar12 + -1, bVar17) {
        auVar49 = *(undefined1 (*) [16])*pauVar13;
        auVar25._8_4_ = 0x42b0c0a5;
        auVar25._0_8_ = 0x42b0c0a542b0c0a5;
        auVar25._12_4_ = 0x42b0c0a5;
        auVar41 = vminps_avx(auVar49,auVar25);
        auVar38._8_4_ = 0xc2b0c0a5;
        auVar38._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar38._12_4_ = 0xc2b0c0a5;
        auVar111 = vmaxps_avx(auVar41,auVar38);
        auVar39._0_4_ = auVar111._0_4_ * 1.442695 + 0.5;
        auVar39._4_4_ = auVar111._4_4_ * 1.442695 + 0.5;
        auVar39._8_4_ = auVar111._8_4_ * 1.442695 + 0.5;
        auVar39._12_4_ = auVar111._12_4_ * 1.442695 + 0.5;
        auVar86._0_4_ = (int)auVar39._0_4_;
        auVar86._4_4_ = (int)auVar39._4_4_;
        auVar86._8_4_ = (int)auVar39._8_4_;
        auVar86._12_4_ = (int)auVar39._12_4_;
        auVar88 = vcvtdq2ps_avx(auVar86);
        auVar41 = vcmpps_avx(auVar39,auVar88,1);
        auVar41 = vandps_avx(auVar119,auVar41);
        auVar41 = vsubps_avx(auVar88,auVar41);
        auVar87._0_4_ = auVar41._0_4_ * 0.6931472;
        auVar87._4_4_ = auVar41._4_4_ * 0.6931472;
        auVar87._8_4_ = auVar41._8_4_ * 0.6931472;
        auVar87._12_4_ = auVar41._12_4_ * 0.6931472;
        auVar88 = vsubps_avx(auVar111,auVar87);
        fVar36 = auVar88._0_4_;
        fVar74 = auVar88._4_4_;
        fVar76 = auVar88._8_4_;
        fVar78 = auVar88._12_4_;
        auVar40._0_4_ = (int)auVar41._0_4_;
        auVar40._4_4_ = (int)auVar41._4_4_;
        auVar40._8_4_ = (int)auVar41._8_4_;
        auVar40._12_4_ = (int)auVar41._12_4_;
        auVar41 = vpslld_avx(auVar40,0x17);
        auVar41 = vpaddd_avx(auVar119,auVar41);
        auVar26._0_4_ =
             (fVar36 + 1.0 +
             fVar36 * fVar36 *
             (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
               0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5)) * auVar41._0_4_ + 1.0;
        auVar26._4_4_ =
             (fVar74 + 1.0 +
             fVar74 * fVar74 *
             (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
               0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5)) * auVar41._4_4_ + 1.0;
        auVar26._8_4_ =
             (fVar76 + 1.0 +
             fVar76 * fVar76 *
             (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) * fVar76 +
               0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5)) * auVar41._8_4_ + 1.0;
        auVar26._12_4_ =
             (fVar78 + 1.0 +
             fVar78 * fVar78 *
             (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78 +
               0.041665796) * fVar78 + 0.16666666) * fVar78 + 0.5)) * auVar41._12_4_ + 1.0;
        auVar42._8_4_ = 0x800000;
        auVar42._0_8_ = 0x80000000800000;
        auVar42._12_4_ = 0x800000;
        auVar41 = vmaxps_avx(auVar26,auVar42);
        auVar88 = vpsrld_avx(auVar41,0x17);
        auVar101._8_4_ = 0xffffff82;
        auVar101._0_8_ = 0xffffff82ffffff82;
        auVar101._12_4_ = 0xffffff82;
        auVar88 = vpaddd_avx(auVar88,auVar101);
        auVar102._8_4_ = 0x807fffff;
        auVar102._0_8_ = 0x807fffff807fffff;
        auVar102._12_4_ = 0x807fffff;
        auVar41 = vandps_avx(auVar41,auVar102);
        auVar19 = vorps_avx(auVar124,auVar41);
        auVar111 = vcvtdq2ps_avx(auVar88);
        auVar103._8_4_ = 0x3f3504f3;
        auVar103._0_8_ = 0x3f3504f33f3504f3;
        auVar103._12_4_ = 0x3f3504f3;
        auVar88 = vcmpps_avx(auVar19,auVar103,1);
        auVar41 = vandps_avx(auVar88,auVar19);
        fVar36 = auVar19._0_4_ + -1.0 + auVar41._0_4_;
        fVar74 = auVar19._4_4_ + -1.0 + auVar41._4_4_;
        fVar76 = auVar19._8_4_ + -1.0 + auVar41._8_4_;
        fVar78 = auVar19._12_4_ + -1.0 + auVar41._12_4_;
        auVar41 = vandps_avx(auVar119,auVar88);
        auVar88 = vsubps_avx(auVar111,auVar41);
        auVar41 = vcmpps_avx(auVar26,_DAT_002d6030,2);
        auVar43._0_4_ =
             (auVar88._0_4_ * 0.6931472 + fVar36 +
             fVar36 * fVar36 *
             (((((((((fVar36 * 0.070376836 + -0.1151461) * fVar36 + 0.116769984) * fVar36 +
                   -0.12420141) * fVar36 + 0.14249323) * fVar36 + -0.16668057) * fVar36 + 0.20000714
                ) * fVar36 + -0.24999994) * fVar36 + 0.3333333) * fVar36 + -0.5)) * -2.0;
        auVar43._4_4_ =
             (auVar88._4_4_ * 0.6931472 + fVar74 +
             fVar74 * fVar74 *
             (((((((((fVar74 * 0.070376836 + -0.1151461) * fVar74 + 0.116769984) * fVar74 +
                   -0.12420141) * fVar74 + 0.14249323) * fVar74 + -0.16668057) * fVar74 + 0.20000714
                ) * fVar74 + -0.24999994) * fVar74 + 0.3333333) * fVar74 + -0.5)) * -2.0;
        auVar43._8_4_ =
             (auVar88._8_4_ * 0.6931472 + fVar76 +
             fVar76 * fVar76 *
             (((((((((fVar76 * 0.070376836 + -0.1151461) * fVar76 + 0.116769984) * fVar76 +
                   -0.12420141) * fVar76 + 0.14249323) * fVar76 + -0.16668057) * fVar76 + 0.20000714
                ) * fVar76 + -0.24999994) * fVar76 + 0.3333333) * fVar76 + -0.5)) * -2.0;
        auVar43._12_4_ =
             (auVar88._12_4_ * 0.6931472 + fVar78 +
             fVar78 * fVar78 *
             (((((((((fVar78 * 0.070376836 + -0.1151461) * fVar78 + 0.116769984) * fVar78 +
                   -0.12420141) * fVar78 + 0.14249323) * fVar78 + -0.16668057) * fVar78 + 0.20000714
                ) * fVar78 + -0.24999994) * fVar78 + 0.3333333) * fVar78 + -0.5)) * -2.0;
        auVar89._8_4_ = 0x7fffffff;
        auVar89._0_8_ = 0x7fffffff7fffffff;
        auVar89._12_4_ = 0x7fffffff;
        auVar41 = vblendvps_avx(auVar43,auVar89,auVar41);
        auVar44._8_4_ = 0x42b0c0a5;
        auVar44._0_8_ = 0x42b0c0a542b0c0a5;
        auVar44._12_4_ = 0x42b0c0a5;
        auVar41 = vminps_avx(auVar41,auVar44);
        auVar45._8_4_ = 0xc2b0c0a5;
        auVar45._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar45._12_4_ = 0xc2b0c0a5;
        auVar111 = vmaxps_avx(auVar41,auVar45);
        auVar46._0_4_ = auVar111._0_4_ * 1.442695 + 0.5;
        auVar46._4_4_ = auVar111._4_4_ * 1.442695 + 0.5;
        auVar46._8_4_ = auVar111._8_4_ * 1.442695 + 0.5;
        auVar46._12_4_ = auVar111._12_4_ * 1.442695 + 0.5;
        auVar90._0_4_ = (int)auVar46._0_4_;
        auVar90._4_4_ = (int)auVar46._4_4_;
        auVar90._8_4_ = (int)auVar46._8_4_;
        auVar90._12_4_ = (int)auVar46._12_4_;
        auVar88 = vcvtdq2ps_avx(auVar90);
        auVar41 = vcmpps_avx(auVar46,auVar88,1);
        auVar41 = vandps_avx(auVar119,auVar41);
        auVar41 = vsubps_avx(auVar88,auVar41);
        auVar91._0_4_ = auVar41._0_4_ * 0.6931472;
        auVar91._4_4_ = auVar41._4_4_ * 0.6931472;
        auVar91._8_4_ = auVar41._8_4_ * 0.6931472;
        auVar91._12_4_ = auVar41._12_4_ * 0.6931472;
        auVar88 = vsubps_avx(auVar111,auVar91);
        fVar36 = auVar88._0_4_;
        fVar74 = auVar88._4_4_;
        fVar76 = auVar88._8_4_;
        fVar78 = auVar88._12_4_;
        auVar47._0_4_ = (int)auVar41._0_4_;
        auVar47._4_4_ = (int)auVar41._4_4_;
        auVar47._8_4_ = (int)auVar41._8_4_;
        auVar47._12_4_ = (int)auVar41._12_4_;
        auVar41 = vpslld_avx(auVar47,0x17);
        auVar41 = vpaddd_avx(auVar119,auVar41);
        auVar27._0_4_ =
             (fVar36 + 1.0 +
             fVar36 * fVar36 *
             (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
               0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5)) * auVar41._0_4_ + 1.0;
        auVar27._4_4_ =
             (fVar74 + 1.0 +
             fVar74 * fVar74 *
             (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
               0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5)) * auVar41._4_4_ + 1.0;
        auVar27._8_4_ =
             (fVar76 + 1.0 +
             fVar76 * fVar76 *
             (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) * fVar76 +
               0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5)) * auVar41._8_4_ + 1.0;
        auVar27._12_4_ =
             (fVar78 + 1.0 +
             fVar78 * fVar78 *
             (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78 +
               0.041665796) * fVar78 + 0.16666666) * fVar78 + 0.5)) * auVar41._12_4_ + 1.0;
        auVar41 = vrcpps_avx(auVar27);
        fVar36 = auVar41._0_4_;
        fVar74 = auVar41._4_4_;
        fVar76 = auVar41._8_4_;
        fVar78 = auVar41._12_4_;
        auVar28._0_4_ = auVar27._0_4_ * (fVar36 + fVar36);
        auVar28._4_4_ = auVar27._4_4_ * (fVar74 + fVar74);
        auVar28._8_4_ = auVar27._8_4_ * (fVar76 + fVar76);
        auVar28._12_4_ = auVar27._12_4_ * (fVar78 + fVar78);
        auVar104._8_4_ = 0x40000000;
        auVar104._0_8_ = 0x4000000040000000;
        auVar104._12_4_ = 0x40000000;
        auVar41 = vsubps_avx(auVar104,auVar28);
        auVar18._0_4_ = (fVar36 + fVar36 + -1.0 + fVar36 * auVar41._0_4_) * auVar49._0_4_;
        auVar18._4_4_ = (fVar74 + fVar74 + -1.0 + fVar74 * auVar41._4_4_) * auVar49._4_4_;
        auVar18._8_4_ = (fVar76 + fVar76 + -1.0 + fVar76 * auVar41._8_4_) * auVar49._8_4_;
        auVar18._12_4_ = (fVar78 + fVar78 + -1.0 + fVar78 * auVar41._12_4_) * auVar49._12_4_;
        *(undefined1 (*) [16])*pauVar13 = auVar18;
        pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
      }
    }
  }
  else {
    if (iVar14 < 1) {
      iVar14 = _c;
    }
    for (; _c != iVar14; _c = _c + 1) {
      in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
      Mat::channel(&local_78,bottom_top_blob,_c);
      pvVar11 = local_78.data;
      Mat::~Mat(&local_78);
      lVar15 = 0;
      pauVar13 = (undefined1 (*) [32])pvVar11;
      for (iVar12 = 0; iVar12 + 7 < iVar16; iVar12 = iVar12 + 8) {
        auVar1 = *pauVar13;
        auVar116._8_4_ = 0x42b0c0a5;
        auVar116._0_8_ = 0x42b0c0a542b0c0a5;
        auVar116._12_4_ = 0x42b0c0a5;
        auVar116._16_4_ = 0x42b0c0a5;
        auVar116._20_4_ = 0x42b0c0a5;
        auVar116._24_4_ = 0x42b0c0a5;
        auVar116._28_4_ = 0x42b0c0a5;
        auVar21 = vminps_avx(auVar1,auVar116);
        auVar118._8_4_ = 0xc2b0c0a5;
        auVar118._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar118._12_4_ = 0xc2b0c0a5;
        auVar118._16_4_ = 0xc2b0c0a5;
        auVar118._20_4_ = 0xc2b0c0a5;
        auVar118._24_4_ = 0xc2b0c0a5;
        auVar118._28_4_ = 0xc2b0c0a5;
        auVar2 = vmaxps_avx(auVar118,auVar21);
        auVar121._8_4_ = 0x3f000000;
        auVar121._0_8_ = 0x3f0000003f000000;
        auVar121._12_4_ = 0x3f000000;
        auVar121._16_4_ = 0x3f000000;
        auVar121._20_4_ = 0x3f000000;
        auVar121._24_4_ = 0x3f000000;
        auVar121._28_4_ = 0x3f000000;
        auVar67._0_4_ = auVar2._0_4_ * 1.442695 + 0.5;
        auVar67._4_4_ = auVar2._4_4_ * 1.442695 + 0.5;
        auVar67._8_4_ = auVar2._8_4_ * 1.442695 + 0.5;
        auVar67._12_4_ = auVar2._12_4_ * 1.442695 + 0.5;
        auVar67._16_4_ = auVar2._16_4_ * 1.442695 + 0.5;
        auVar67._20_4_ = auVar2._20_4_ * 1.442695 + 0.5;
        auVar67._24_4_ = auVar2._24_4_ * 1.442695 + 0.5;
        auVar67._28_4_ = in_ZMM2._28_4_ + 0.5;
        auVar22 = vroundps_avx(auVar67,1);
        auVar21 = vcmpps_avx(auVar67,auVar22,1);
        auVar123._8_4_ = 0x3f800000;
        auVar123._0_8_ = 0x3f8000003f800000;
        auVar123._12_4_ = 0x3f800000;
        auVar123._16_4_ = 0x3f800000;
        auVar123._20_4_ = 0x3f800000;
        auVar123._24_4_ = 0x3f800000;
        auVar123._28_4_ = 0x3f800000;
        auVar21 = vandps_avx(auVar123,auVar21);
        auVar21 = vsubps_avx(auVar22,auVar21);
        auVar6._4_4_ = auVar21._4_4_ * 0.6931472;
        auVar6._0_4_ = auVar21._0_4_ * 0.6931472;
        auVar6._8_4_ = auVar21._8_4_ * 0.6931472;
        auVar6._12_4_ = auVar21._12_4_ * 0.6931472;
        auVar6._16_4_ = auVar21._16_4_ * 0.6931472;
        auVar6._20_4_ = auVar21._20_4_ * 0.6931472;
        auVar6._24_4_ = auVar21._24_4_ * 0.6931472;
        auVar6._28_4_ = auVar22._28_4_;
        auVar2 = vsubps_avx(auVar2,auVar6);
        fVar36 = auVar2._0_4_;
        fVar74 = auVar2._4_4_;
        fVar76 = auVar2._8_4_;
        fVar78 = auVar2._12_4_;
        fVar80 = auVar2._16_4_;
        fVar82 = auVar2._20_4_;
        fVar84 = auVar2._24_4_;
        auVar48._0_4_ = (int)auVar21._0_4_;
        auVar48._4_4_ = (int)auVar21._4_4_;
        auVar48._8_4_ = (int)auVar21._8_4_;
        auVar48._12_4_ = (int)auVar21._12_4_;
        auVar68._16_4_ = (int)auVar21._16_4_;
        auVar68._0_16_ = auVar48;
        auVar68._20_4_ = (int)auVar21._20_4_;
        auVar68._24_4_ = (int)auVar21._24_4_;
        auVar68._28_4_ = (int)auVar21._28_4_;
        auVar41 = vpslld_avx(auVar48,0x17);
        auVar49 = vpslld_avx(auVar68._16_16_,0x17);
        auVar19._8_4_ = 0x3f800000;
        auVar19._0_8_ = 0x3f8000003f800000;
        auVar19._12_4_ = 0x3f800000;
        auVar49 = vpaddd_avx(auVar49,auVar19);
        auVar41 = vpaddd_avx(auVar41,auVar19);
        auVar34._0_4_ =
             (fVar36 + 1.0 +
             fVar36 * fVar36 *
             (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
               0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5)) * auVar41._0_4_ + 1.0;
        auVar34._4_4_ =
             (fVar74 + 1.0 +
             fVar74 * fVar74 *
             (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
               0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5)) * auVar41._4_4_ + 1.0;
        auVar34._8_4_ =
             (fVar76 + 1.0 +
             fVar76 * fVar76 *
             (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) * fVar76 +
               0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5)) * auVar41._8_4_ + 1.0;
        auVar34._12_4_ =
             (fVar78 + 1.0 +
             fVar78 * fVar78 *
             (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78 +
               0.041665796) * fVar78 + 0.16666666) * fVar78 + 0.5)) * auVar41._12_4_ + 1.0;
        auVar34._16_4_ =
             (fVar80 + 1.0 +
             fVar80 * fVar80 *
             (((((fVar80 * 0.00019875691 + 0.0013981999) * fVar80 + 0.008333452) * fVar80 +
               0.041665796) * fVar80 + 0.16666666) * fVar80 + 0.5)) * auVar49._0_4_ + 1.0;
        auVar34._20_4_ =
             (fVar82 + 1.0 +
             fVar82 * fVar82 *
             (((((fVar82 * 0.00019875691 + 0.0013981999) * fVar82 + 0.008333452) * fVar82 +
               0.041665796) * fVar82 + 0.16666666) * fVar82 + 0.5)) * auVar49._4_4_ + 1.0;
        auVar34._24_4_ =
             (fVar84 + 1.0 +
             fVar84 * fVar84 *
             (((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84 +
               0.041665796) * fVar84 + 0.16666666) * fVar84 + 0.5)) * auVar49._8_4_ + 1.0;
        auVar34._28_4_ = auVar2._28_4_ + 1.0 + auVar22._28_4_ + 1.0;
        auVar69._8_4_ = 0x800000;
        auVar69._0_8_ = 0x80000000800000;
        auVar69._12_4_ = 0x800000;
        auVar69._16_4_ = 0x800000;
        auVar69._20_4_ = 0x800000;
        auVar69._24_4_ = 0x800000;
        auVar69._28_4_ = 0x800000;
        auVar22 = vmaxps_avx(auVar34,auVar69);
        auVar49 = vpsrld_avx(auVar22._16_16_,0x17);
        auVar70._8_4_ = 0x807fffff;
        auVar70._0_8_ = 0x807fffff807fffff;
        auVar70._12_4_ = 0x807fffff;
        auVar70._16_4_ = 0x807fffff;
        auVar70._20_4_ = 0x807fffff;
        auVar70._24_4_ = 0x807fffff;
        auVar70._28_4_ = 0x807fffff;
        auVar21 = vandps_avx(auVar22,auVar70);
        auVar3 = vorps_avx(auVar121,auVar21);
        auVar110._8_4_ = 0x3f3504f3;
        auVar110._0_8_ = 0x3f3504f33f3504f3;
        auVar110._12_4_ = 0x3f3504f3;
        auVar110._16_4_ = 0x3f3504f3;
        auVar110._20_4_ = 0x3f3504f3;
        auVar110._24_4_ = 0x3f3504f3;
        auVar110._28_4_ = 0x3f3504f3;
        auVar2 = vcmpps_avx(auVar110,auVar3,2);
        auVar21 = vandnps_avx(auVar2,auVar3);
        fVar36 = auVar3._0_4_ + -1.0 + auVar21._0_4_;
        fVar74 = auVar3._4_4_ + -1.0 + auVar21._4_4_;
        fVar76 = auVar3._8_4_ + -1.0 + auVar21._8_4_;
        fVar78 = auVar3._12_4_ + -1.0 + auVar21._12_4_;
        fVar80 = auVar3._16_4_ + -1.0 + auVar21._16_4_;
        fVar82 = auVar3._20_4_ + -1.0 + auVar21._20_4_;
        fVar84 = auVar3._24_4_ + -1.0 + auVar21._24_4_;
        auVar49 = vpsubd_avx(auVar49,auVar2._16_16_);
        auVar41 = vpsrld_avx(auVar22._0_16_,0x17);
        auVar112._8_4_ = 0xffffff81;
        auVar112._0_8_ = 0xffffff81ffffff81;
        auVar112._12_4_ = 0xffffff81;
        auVar49 = vpaddd_avx(auVar49,auVar112);
        auVar41 = vpsubd_avx(auVar41,auVar2._0_16_);
        auVar41 = vpaddd_avx(auVar41,auVar112);
        auVar99._16_16_ = auVar49;
        auVar99._0_16_ = auVar41;
        auVar2 = vcmpps_avx(auVar34,_DAT_002d8520,2);
        auVar22 = vcvtdq2ps_avx(auVar99);
        auVar7._4_4_ = (auVar22._4_4_ * 0.6931472 + fVar74 +
                       fVar74 * fVar74 *
                       (((((((((fVar74 * 0.070376836 + -0.1151461) * fVar74 + 0.116769984) * fVar74
                             + -0.12420141) * fVar74 + 0.14249323) * fVar74 + -0.16668057) * fVar74
                          + 0.20000714) * fVar74 + -0.24999994) * fVar74 + 0.3333333) * fVar74 +
                       -0.5)) * -2.0;
        auVar7._0_4_ = (auVar22._0_4_ * 0.6931472 + fVar36 +
                       fVar36 * fVar36 *
                       (((((((((fVar36 * 0.070376836 + -0.1151461) * fVar36 + 0.116769984) * fVar36
                             + -0.12420141) * fVar36 + 0.14249323) * fVar36 + -0.16668057) * fVar36
                          + 0.20000714) * fVar36 + -0.24999994) * fVar36 + 0.3333333) * fVar36 +
                       -0.5)) * -2.0;
        auVar7._8_4_ = (auVar22._8_4_ * 0.6931472 + fVar76 +
                       fVar76 * fVar76 *
                       (((((((((fVar76 * 0.070376836 + -0.1151461) * fVar76 + 0.116769984) * fVar76
                             + -0.12420141) * fVar76 + 0.14249323) * fVar76 + -0.16668057) * fVar76
                          + 0.20000714) * fVar76 + -0.24999994) * fVar76 + 0.3333333) * fVar76 +
                       -0.5)) * -2.0;
        auVar7._12_4_ =
             (auVar22._12_4_ * 0.6931472 + fVar78 +
             fVar78 * fVar78 *
             (((((((((fVar78 * 0.070376836 + -0.1151461) * fVar78 + 0.116769984) * fVar78 +
                   -0.12420141) * fVar78 + 0.14249323) * fVar78 + -0.16668057) * fVar78 + 0.20000714
                ) * fVar78 + -0.24999994) * fVar78 + 0.3333333) * fVar78 + -0.5)) * -2.0;
        auVar7._16_4_ =
             (auVar22._16_4_ * 0.6931472 + fVar80 +
             fVar80 * fVar80 *
             (((((((((fVar80 * 0.070376836 + -0.1151461) * fVar80 + 0.116769984) * fVar80 +
                   -0.12420141) * fVar80 + 0.14249323) * fVar80 + -0.16668057) * fVar80 + 0.20000714
                ) * fVar80 + -0.24999994) * fVar80 + 0.3333333) * fVar80 + -0.5)) * -2.0;
        auVar7._20_4_ =
             (auVar22._20_4_ * 0.6931472 + fVar82 +
             fVar82 * fVar82 *
             (((((((((fVar82 * 0.070376836 + -0.1151461) * fVar82 + 0.116769984) * fVar82 +
                   -0.12420141) * fVar82 + 0.14249323) * fVar82 + -0.16668057) * fVar82 + 0.20000714
                ) * fVar82 + -0.24999994) * fVar82 + 0.3333333) * fVar82 + -0.5)) * -2.0;
        auVar7._24_4_ =
             (auVar22._24_4_ * 0.6931472 + fVar84 +
             fVar84 * fVar84 *
             (((((((((fVar84 * 0.070376836 + -0.1151461) * fVar84 + 0.116769984) * fVar84 +
                   -0.12420141) * fVar84 + 0.14249323) * fVar84 + -0.16668057) * fVar84 + 0.20000714
                ) * fVar84 + -0.24999994) * fVar84 + 0.3333333) * fVar84 + -0.5)) * -2.0;
        auVar7._28_4_ = auVar22._28_4_ + auVar3._28_4_ + -1.0 + auVar21._28_4_ + 0.0;
        auVar100._8_4_ = 0x7fffffff;
        auVar100._0_8_ = 0x7fffffff7fffffff;
        auVar100._12_4_ = 0x7fffffff;
        auVar100._16_4_ = 0x7fffffff;
        auVar100._20_4_ = 0x7fffffff;
        auVar100._24_4_ = 0x7fffffff;
        auVar100._28_4_ = 0x7fffffff;
        auVar21 = vblendvps_avx(auVar7,auVar100,auVar2);
        auVar71._8_4_ = 0x42b0c0a5;
        auVar71._0_8_ = 0x42b0c0a542b0c0a5;
        auVar71._12_4_ = 0x42b0c0a5;
        auVar71._16_4_ = 0x42b0c0a5;
        auVar71._20_4_ = 0x42b0c0a5;
        auVar71._24_4_ = 0x42b0c0a5;
        auVar71._28_4_ = 0x42b0c0a5;
        auVar21 = vminps_avx(auVar21,auVar71);
        auVar2 = vmaxps_avx(auVar118,auVar21);
        auVar72._0_4_ = auVar2._0_4_ * 1.442695 + 0.5;
        auVar72._4_4_ = auVar2._4_4_ * 1.442695 + 0.5;
        auVar72._8_4_ = auVar2._8_4_ * 1.442695 + 0.5;
        auVar72._12_4_ = auVar2._12_4_ * 1.442695 + 0.5;
        auVar72._16_4_ = auVar2._16_4_ * 1.442695 + 0.5;
        auVar72._20_4_ = auVar2._20_4_ * 1.442695 + 0.5;
        auVar72._24_4_ = auVar2._24_4_ * 1.442695 + 0.5;
        auVar72._28_4_ = 0x42b1c0a5;
        auVar22 = vroundps_avx(auVar72,1);
        auVar21 = vcmpps_avx(auVar72,auVar22,1);
        auVar21 = vandps_avx(auVar123,auVar21);
        auVar21 = vsubps_avx(auVar22,auVar21);
        auVar8._4_4_ = auVar21._4_4_ * 0.6931472;
        auVar8._0_4_ = auVar21._0_4_ * 0.6931472;
        auVar8._8_4_ = auVar21._8_4_ * 0.6931472;
        auVar8._12_4_ = auVar21._12_4_ * 0.6931472;
        auVar8._16_4_ = auVar21._16_4_ * 0.6931472;
        auVar8._20_4_ = auVar21._20_4_ * 0.6931472;
        auVar8._24_4_ = auVar21._24_4_ * 0.6931472;
        auVar8._28_4_ = auVar22._28_4_;
        auVar2 = vsubps_avx(auVar2,auVar8);
        fVar36 = auVar2._0_4_;
        fVar74 = auVar2._4_4_;
        fVar76 = auVar2._8_4_;
        fVar78 = auVar2._12_4_;
        fVar80 = auVar2._16_4_;
        fVar82 = auVar2._20_4_;
        fVar84 = auVar2._24_4_;
        auVar50._0_4_ = (int)auVar21._0_4_;
        auVar50._4_4_ = (int)auVar21._4_4_;
        auVar50._8_4_ = (int)auVar21._8_4_;
        auVar50._12_4_ = (int)auVar21._12_4_;
        auVar73._16_4_ = (int)auVar21._16_4_;
        auVar73._0_16_ = auVar50;
        auVar73._20_4_ = (int)auVar21._20_4_;
        auVar73._24_4_ = (int)auVar21._24_4_;
        auVar73._28_4_ = (int)auVar21._28_4_;
        auVar41 = vpslld_avx(auVar50,0x17);
        auVar49 = vpslld_avx(auVar73._16_16_,0x17);
        auVar49 = vpaddd_avx(auVar49,auVar19);
        auVar41 = vpaddd_avx(auVar41,auVar19);
        auVar35._0_4_ =
             (fVar36 + 1.0 +
             fVar36 * fVar36 *
             (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
               0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5)) * auVar41._0_4_ + 1.0;
        auVar35._4_4_ =
             (fVar74 + 1.0 +
             fVar74 * fVar74 *
             (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
               0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5)) * auVar41._4_4_ + 1.0;
        auVar35._8_4_ =
             (fVar76 + 1.0 +
             fVar76 * fVar76 *
             (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) * fVar76 +
               0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5)) * auVar41._8_4_ + 1.0;
        auVar35._12_4_ =
             (fVar78 + 1.0 +
             fVar78 * fVar78 *
             (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78 +
               0.041665796) * fVar78 + 0.16666666) * fVar78 + 0.5)) * auVar41._12_4_ + 1.0;
        auVar35._16_4_ =
             (fVar80 + 1.0 +
             fVar80 * fVar80 *
             (((((fVar80 * 0.00019875691 + 0.0013981999) * fVar80 + 0.008333452) * fVar80 +
               0.041665796) * fVar80 + 0.16666666) * fVar80 + 0.5)) * auVar49._0_4_ + 1.0;
        auVar35._20_4_ =
             (fVar82 + 1.0 +
             fVar82 * fVar82 *
             (((((fVar82 * 0.00019875691 + 0.0013981999) * fVar82 + 0.008333452) * fVar82 +
               0.041665796) * fVar82 + 0.16666666) * fVar82 + 0.5)) * auVar49._4_4_ + 1.0;
        auVar35._24_4_ =
             (fVar84 + 1.0 +
             fVar84 * fVar84 *
             (((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84 +
               0.041665796) * fVar84 + 0.16666666) * fVar84 + 0.5)) * auVar49._8_4_ + 1.0;
        auVar35._28_4_ = auVar2._28_4_ + 1.0 + auVar22._28_4_ + 1.0;
        auVar21 = vrcpps_avx(auVar35);
        fVar36 = auVar21._0_4_;
        fVar74 = auVar21._4_4_;
        fVar76 = auVar21._8_4_;
        fVar78 = auVar21._12_4_;
        fVar80 = auVar21._16_4_;
        fVar82 = auVar21._20_4_;
        fVar84 = auVar21._24_4_;
        auVar9._4_4_ = auVar35._4_4_ * (fVar74 + fVar74);
        auVar9._0_4_ = auVar35._0_4_ * (fVar36 + fVar36);
        auVar9._8_4_ = auVar35._8_4_ * (fVar76 + fVar76);
        auVar9._12_4_ = auVar35._12_4_ * (fVar78 + fVar78);
        auVar9._16_4_ = auVar35._16_4_ * (fVar80 + fVar80);
        auVar9._20_4_ = auVar35._20_4_ * (fVar82 + fVar82);
        auVar9._24_4_ = auVar35._24_4_ * (fVar84 + fVar84);
        auVar9._28_4_ = auVar35._28_4_;
        auVar24._8_4_ = 0x40000000;
        auVar24._0_8_ = 0x4000000040000000;
        auVar24._12_4_ = 0x40000000;
        auVar24._16_4_ = 0x40000000;
        auVar24._20_4_ = 0x40000000;
        auVar24._24_4_ = 0x40000000;
        auVar24._28_4_ = 0x40000000;
        auVar2 = vsubps_avx(auVar24,auVar9);
        fVar37 = fVar36 + fVar36 + -1.0;
        fVar75 = fVar74 + fVar74 + -1.0;
        fVar77 = fVar76 + fVar76 + -1.0;
        fVar79 = fVar78 + fVar78 + -1.0;
        fVar81 = fVar80 + fVar80 + -1.0;
        fVar83 = fVar82 + fVar82 + -1.0;
        fVar85 = fVar84 + fVar84 + -1.0;
        in_ZMM2 = ZEXT3264(CONCAT428(auVar21._28_4_ + auVar21._28_4_ + -1.0,
                                     CONCAT424(fVar85,CONCAT420(fVar83,CONCAT416(fVar81,CONCAT412(
                                                  fVar79,CONCAT48(fVar77,CONCAT44(fVar75,fVar37)))))
                                              )));
        local_98 = auVar1._0_4_;
        fStack_94 = auVar1._4_4_;
        fStack_90 = auVar1._8_4_;
        fStack_8c = auVar1._12_4_;
        fStack_88 = auVar1._16_4_;
        fStack_84 = auVar1._20_4_;
        fStack_80 = auVar1._24_4_;
        auVar10._4_4_ = (fVar75 + fVar74 * auVar2._4_4_) * fStack_94;
        auVar10._0_4_ = (fVar37 + fVar36 * auVar2._0_4_) * local_98;
        auVar10._8_4_ = (fVar77 + fVar76 * auVar2._8_4_) * fStack_90;
        auVar10._12_4_ = (fVar79 + fVar78 * auVar2._12_4_) * fStack_8c;
        auVar10._16_4_ = (fVar81 + fVar80 * auVar2._16_4_) * fStack_88;
        auVar10._20_4_ = (fVar83 + fVar82 * auVar2._20_4_) * fStack_84;
        auVar10._24_4_ = (fVar85 + fVar84 * auVar2._24_4_) * fStack_80;
        auVar10._28_4_ = 0x40000000;
        *pauVar13 = auVar10;
        pauVar13 = pauVar13 + 1;
        lVar15 = lVar15 + 8;
      }
      for (; iVar12 + 3 < iVar16; iVar12 = iVar12 + 4) {
        auVar49 = *(undefined1 (*) [16])*pauVar13;
        auVar114._8_4_ = 0x42b0c0a5;
        auVar114._0_8_ = 0x42b0c0a542b0c0a5;
        auVar114._12_4_ = 0x42b0c0a5;
        auVar41 = vminps_avx(auVar49,auVar114);
        auVar117._8_4_ = 0xc2b0c0a5;
        auVar117._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar117._12_4_ = 0xc2b0c0a5;
        auVar111 = vmaxps_avx(auVar117,auVar41);
        auVar120._8_4_ = 0x3f000000;
        auVar120._0_8_ = 0x3f0000003f000000;
        auVar120._12_4_ = 0x3f000000;
        auVar51._0_4_ = auVar111._0_4_ * 1.442695 + 0.5;
        auVar51._4_4_ = auVar111._4_4_ * 1.442695 + 0.5;
        auVar51._8_4_ = auVar111._8_4_ * 1.442695 + 0.5;
        auVar51._12_4_ = auVar111._12_4_ * 1.442695 + 0.5;
        auVar92._0_4_ = (int)auVar51._0_4_;
        auVar92._4_4_ = (int)auVar51._4_4_;
        auVar92._8_4_ = (int)auVar51._8_4_;
        auVar92._12_4_ = (int)auVar51._12_4_;
        auVar88 = vcvtdq2ps_avx(auVar92);
        auVar41 = vcmpps_avx(auVar51,auVar88,1);
        auVar113._8_4_ = 0x3f800000;
        auVar113._0_8_ = 0x3f8000003f800000;
        auVar113._12_4_ = 0x3f800000;
        auVar41 = vandps_avx(auVar41,auVar113);
        auVar41 = vsubps_avx(auVar88,auVar41);
        auVar93._0_4_ = auVar41._0_4_ * 0.6931472;
        auVar93._4_4_ = auVar41._4_4_ * 0.6931472;
        auVar93._8_4_ = auVar41._8_4_ * 0.6931472;
        auVar93._12_4_ = auVar41._12_4_ * 0.6931472;
        auVar88 = vsubps_avx(auVar111,auVar93);
        fVar36 = auVar88._0_4_;
        fVar74 = auVar88._4_4_;
        fVar76 = auVar88._8_4_;
        fVar78 = auVar88._12_4_;
        auVar52._0_4_ = (int)auVar41._0_4_;
        auVar52._4_4_ = (int)auVar41._4_4_;
        auVar52._8_4_ = (int)auVar41._8_4_;
        auVar52._12_4_ = (int)auVar41._12_4_;
        auVar41 = vpslld_avx(auVar52,0x17);
        auVar41 = vpaddd_avx(auVar41,auVar113);
        auVar29._0_4_ =
             (fVar36 + 1.0 +
             fVar36 * fVar36 *
             (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
               0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5)) * auVar41._0_4_ + 1.0;
        auVar29._4_4_ =
             (fVar74 + 1.0 +
             fVar74 * fVar74 *
             (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
               0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5)) * auVar41._4_4_ + 1.0;
        auVar29._8_4_ =
             (fVar76 + 1.0 +
             fVar76 * fVar76 *
             (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) * fVar76 +
               0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5)) * auVar41._8_4_ + 1.0;
        auVar29._12_4_ =
             (fVar78 + 1.0 +
             fVar78 * fVar78 *
             (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78 +
               0.041665796) * fVar78 + 0.16666666) * fVar78 + 0.5)) * auVar41._12_4_ + 1.0;
        auVar53._8_4_ = 0x800000;
        auVar53._0_8_ = 0x80000000800000;
        auVar53._12_4_ = 0x800000;
        auVar41 = vmaxps_avx(auVar29,auVar53);
        auVar88 = vpsrld_avx(auVar41,0x17);
        auVar105._8_4_ = 0xffffff82;
        auVar105._0_8_ = 0xffffff82ffffff82;
        auVar105._12_4_ = 0xffffff82;
        auVar88 = vpaddd_avx(auVar88,auVar105);
        auVar106._8_4_ = 0x807fffff;
        auVar106._0_8_ = 0x807fffff807fffff;
        auVar106._12_4_ = 0x807fffff;
        auVar41 = vandps_avx(auVar41,auVar106);
        auVar19 = vorps_avx(auVar120,auVar41);
        auVar111 = vcvtdq2ps_avx(auVar88);
        auVar107._8_4_ = 0x3f3504f3;
        auVar107._0_8_ = 0x3f3504f33f3504f3;
        auVar107._12_4_ = 0x3f3504f3;
        auVar88 = vcmpps_avx(auVar19,auVar107,1);
        auVar41 = vandps_avx(auVar88,auVar19);
        fVar36 = auVar19._0_4_ + -1.0 + auVar41._0_4_;
        fVar74 = auVar19._4_4_ + -1.0 + auVar41._4_4_;
        fVar76 = auVar19._8_4_ + -1.0 + auVar41._8_4_;
        fVar78 = auVar19._12_4_ + -1.0 + auVar41._12_4_;
        auVar41 = vandps_avx(auVar88,auVar113);
        auVar88 = vsubps_avx(auVar111,auVar41);
        auVar41 = vcmpps_avx(auVar29,_DAT_002d6030,2);
        auVar54._0_4_ =
             (auVar88._0_4_ * 0.6931472 + fVar36 +
             fVar36 * fVar36 *
             (((((((((fVar36 * 0.070376836 + -0.1151461) * fVar36 + 0.116769984) * fVar36 +
                   -0.12420141) * fVar36 + 0.14249323) * fVar36 + -0.16668057) * fVar36 + 0.20000714
                ) * fVar36 + -0.24999994) * fVar36 + 0.3333333) * fVar36 + -0.5)) * -2.0;
        auVar54._4_4_ =
             (auVar88._4_4_ * 0.6931472 + fVar74 +
             fVar74 * fVar74 *
             (((((((((fVar74 * 0.070376836 + -0.1151461) * fVar74 + 0.116769984) * fVar74 +
                   -0.12420141) * fVar74 + 0.14249323) * fVar74 + -0.16668057) * fVar74 + 0.20000714
                ) * fVar74 + -0.24999994) * fVar74 + 0.3333333) * fVar74 + -0.5)) * -2.0;
        auVar54._8_4_ =
             (auVar88._8_4_ * 0.6931472 + fVar76 +
             fVar76 * fVar76 *
             (((((((((fVar76 * 0.070376836 + -0.1151461) * fVar76 + 0.116769984) * fVar76 +
                   -0.12420141) * fVar76 + 0.14249323) * fVar76 + -0.16668057) * fVar76 + 0.20000714
                ) * fVar76 + -0.24999994) * fVar76 + 0.3333333) * fVar76 + -0.5)) * -2.0;
        auVar54._12_4_ =
             (auVar88._12_4_ * 0.6931472 + fVar78 +
             fVar78 * fVar78 *
             (((((((((fVar78 * 0.070376836 + -0.1151461) * fVar78 + 0.116769984) * fVar78 +
                   -0.12420141) * fVar78 + 0.14249323) * fVar78 + -0.16668057) * fVar78 + 0.20000714
                ) * fVar78 + -0.24999994) * fVar78 + 0.3333333) * fVar78 + -0.5)) * -2.0;
        auVar94._8_4_ = 0x7fffffff;
        auVar94._0_8_ = 0x7fffffff7fffffff;
        auVar94._12_4_ = 0x7fffffff;
        auVar41 = vblendvps_avx(auVar54,auVar94,auVar41);
        auVar55._8_4_ = 0x42b0c0a5;
        auVar55._0_8_ = 0x42b0c0a542b0c0a5;
        auVar55._12_4_ = 0x42b0c0a5;
        auVar41 = vminps_avx(auVar41,auVar55);
        auVar56._8_4_ = 0xc2b0c0a5;
        auVar56._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar56._12_4_ = 0xc2b0c0a5;
        auVar111 = vmaxps_avx(auVar41,auVar56);
        auVar57._0_4_ = auVar111._0_4_ * 1.442695 + 0.5;
        auVar57._4_4_ = auVar111._4_4_ * 1.442695 + 0.5;
        auVar57._8_4_ = auVar111._8_4_ * 1.442695 + 0.5;
        auVar57._12_4_ = auVar111._12_4_ * 1.442695 + 0.5;
        auVar95._0_4_ = (int)auVar57._0_4_;
        auVar95._4_4_ = (int)auVar57._4_4_;
        auVar95._8_4_ = (int)auVar57._8_4_;
        auVar95._12_4_ = (int)auVar57._12_4_;
        auVar88 = vcvtdq2ps_avx(auVar95);
        auVar41 = vcmpps_avx(auVar57,auVar88,1);
        auVar41 = vandps_avx(auVar41,auVar113);
        auVar41 = vsubps_avx(auVar88,auVar41);
        auVar96._0_4_ = auVar41._0_4_ * 0.6931472;
        auVar96._4_4_ = auVar41._4_4_ * 0.6931472;
        auVar96._8_4_ = auVar41._8_4_ * 0.6931472;
        auVar96._12_4_ = auVar41._12_4_ * 0.6931472;
        auVar88 = vsubps_avx(auVar111,auVar96);
        fVar36 = auVar88._0_4_;
        fVar74 = auVar88._4_4_;
        fVar76 = auVar88._8_4_;
        fVar78 = auVar88._12_4_;
        auVar58._0_4_ = (int)auVar41._0_4_;
        auVar58._4_4_ = (int)auVar41._4_4_;
        auVar58._8_4_ = (int)auVar41._8_4_;
        auVar58._12_4_ = (int)auVar41._12_4_;
        auVar41 = vpslld_avx(auVar58,0x17);
        auVar41 = vpaddd_avx(auVar41,auVar113);
        auVar30._0_4_ =
             (fVar36 + 1.0 +
             fVar36 * fVar36 *
             (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
               0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5)) * auVar41._0_4_ + 1.0;
        auVar30._4_4_ =
             (fVar74 + 1.0 +
             fVar74 * fVar74 *
             (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
               0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5)) * auVar41._4_4_ + 1.0;
        auVar30._8_4_ =
             (fVar76 + 1.0 +
             fVar76 * fVar76 *
             (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) * fVar76 +
               0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5)) * auVar41._8_4_ + 1.0;
        auVar30._12_4_ =
             (fVar78 + 1.0 +
             fVar78 * fVar78 *
             (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78 +
               0.041665796) * fVar78 + 0.16666666) * fVar78 + 0.5)) * auVar41._12_4_ + 1.0;
        auVar41 = vrcpps_avx(auVar30);
        fVar36 = auVar41._0_4_;
        fVar74 = auVar41._4_4_;
        fVar76 = auVar41._8_4_;
        fVar78 = auVar41._12_4_;
        auVar31._0_4_ = auVar30._0_4_ * (fVar36 + fVar36);
        auVar31._4_4_ = auVar30._4_4_ * (fVar74 + fVar74);
        auVar31._8_4_ = auVar30._8_4_ * (fVar76 + fVar76);
        auVar31._12_4_ = auVar30._12_4_ * (fVar78 + fVar78);
        auVar108._8_4_ = 0x40000000;
        auVar108._0_8_ = 0x4000000040000000;
        auVar108._12_4_ = 0x40000000;
        auVar41 = vsubps_avx(auVar108,auVar31);
        fVar80 = fVar36 + fVar36 + -1.0;
        fVar82 = fVar74 + fVar74 + -1.0;
        fVar84 = fVar76 + fVar76 + -1.0;
        fVar37 = fVar78 + fVar78 + -1.0;
        in_ZMM2 = ZEXT1664(CONCAT412(fVar37,CONCAT48(fVar84,CONCAT44(fVar82,fVar80))));
        auVar20._0_4_ = (fVar80 + fVar36 * auVar41._0_4_) * auVar49._0_4_;
        auVar20._4_4_ = (fVar82 + fVar74 * auVar41._4_4_) * auVar49._4_4_;
        auVar20._8_4_ = (fVar84 + fVar76 * auVar41._8_4_) * auVar49._8_4_;
        auVar20._12_4_ = (fVar37 + fVar78 * auVar41._12_4_) * auVar49._12_4_;
        *(undefined1 (*) [16])*pauVar13 = auVar20;
        pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
        lVar15 = lVar15 + 4;
      }
      for (; (int)lVar15 < iVar16; lVar15 = lVar15 + 1) {
        fVar36 = *(float *)((undefined1 *)pvVar11 + lVar15 * 4);
        in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
        fVar74 = expf(fVar36);
        fVar74 = logf(fVar74 + 1.0);
        fVar74 = tanhf(fVar74);
        *(float *)((undefined1 *)pvVar11 + lVar15 * 4) = fVar74 * fVar36;
      }
    }
  }
  return 0;
}

Assistant:

int Mish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanh(log(exp(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}